

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O1

ssize_t uudecode_filter_read(archive_read_filter *self,void **buff)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  byte *b;
  long lVar6;
  long lVar7;
  ulong uVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  char *fmt;
  uint uVar12;
  uudecode *uudecode;
  archive_read *a;
  long lVar13;
  size_t sVar14;
  size_t unaff_R13;
  size_t sVar15;
  bool bVar16;
  ssize_t avail_in;
  ssize_t nl;
  byte *local_70;
  long local_60;
  size_t local_58;
  uudecode *local_50;
  size_t local_48;
  void **local_40;
  long local_38;
  
  local_50 = (uudecode *)self->data;
  b = (byte *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_58);
  bVar16 = b == (byte *)0x0;
  uudecode = local_50;
  local_40 = buff;
  if ((bVar16) && ((long)local_58 < 0)) {
    return -0x1e;
  }
LAB_00459160:
  if (bVar16) {
    local_58 = 0;
  }
  local_48 = local_58;
  sVar14 = local_58;
  if (uudecode->state != 4) {
    local_70 = uudecode->out_buff;
    if ((long)uudecode->in_cnt != 0) {
      iVar4 = ensure_in_buff_size(self,uudecode,(long)uudecode->in_cnt + local_58);
      if (iVar4 != 0) {
        return -0x1e;
      }
      memcpy(uudecode->in_buff + uudecode->in_cnt,b,local_58);
      b = uudecode->in_buff;
      local_58 = local_58 + (long)uudecode->in_cnt;
      uudecode->in_cnt = 0;
    }
    if (0 < (long)local_58) {
      local_60 = 0;
      sVar14 = 0;
      sVar15 = unaff_R13;
      do {
        sVar3 = local_58;
        unaff_R13 = get_line(b,local_58 - sVar14,&local_38);
        if ((long)unaff_R13 < 0) {
          unaff_R13 = sVar15;
          if ((uudecode->state == 0) && ((0 < uudecode->total || (0 < local_60)))) {
            uudecode->state = 4;
            iVar4 = 3;
            sVar14 = sVar3;
          }
          else {
            archive_set_error(&self->archive->archive,-1,"Insufficient compressed data");
            iVar4 = 1;
          }
        }
        else if ((local_38 == 0) && (uudecode->state != 2)) {
          iVar5 = ensure_in_buff_size(self,uudecode,unaff_R13);
          iVar4 = 1;
          if (iVar5 == 0) {
            if (uudecode->in_buff != b) {
              memmove(uudecode->in_buff,b,unaff_R13);
            }
            uudecode->in_cnt = (int)unaff_R13;
            if (local_60 == 0) {
              __archive_read_filter_consume(self->upstream,local_48);
              iVar4 = 2;
              local_60 = 0;
            }
            else {
              sVar14 = unaff_R13 + sVar14;
              iVar4 = 4;
            }
          }
        }
        else {
          iVar4 = uudecode->state;
          if (iVar4 == 1) {
            iVar4 = 3;
            if ((long)(local_60 + unaff_R13 * 2) < 0x10001) {
              if ((""[*b] != '\0') && (0 < (long)(unaff_R13 - local_38))) {
                uVar12 = *b & 0x3f;
                uVar8 = (ulong)uVar12 ^ 0x20;
                if ((long)uVar8 < (long)(unaff_R13 - local_38)) {
                  if ((char)uVar12 == ' ') {
                    uudecode->state = 2;
                  }
                  else {
                    pbVar11 = b + 1;
                    lVar6 = local_60;
                    do {
                      local_60 = lVar6;
                      if ((long)uVar8 < 1) {
                        uVar8 = 0;
                        break;
                      }
                      if ((""[*pbVar11] == '\0') || (""[pbVar11[1]] == '\0')) {
                        bVar16 = false;
                      }
                      else {
                        pbVar9 = pbVar11 + 2;
                        uVar12 = (pbVar11[1] & 0x3f ^ 0x20) << 0xc | (*pbVar11 ^ 0x20) << 0x12;
                        pbVar10 = local_70 + 1;
                        *local_70 = (byte)(uVar12 >> 0x10);
                        local_60 = lVar6 + 1;
                        if (uVar8 == 1) {
                          uVar8 = 0;
                          pbVar11 = pbVar9;
                        }
                        else {
                          if (""[*pbVar9] == '\0') {
                            uVar8 = uVar8 - 1;
                            bVar16 = false;
                            pbVar11 = pbVar9;
                            uudecode = local_50;
                            local_70 = pbVar10;
                            goto LAB_00459715;
                          }
                          uVar12 = (*pbVar9 & 0x3f ^ 0x20) << 6 | uVar12;
                          local_70[1] = (byte)(uVar12 >> 8);
                          pbVar10 = local_70 + 2;
                          local_60 = lVar6 + 2;
                          uVar8 = uVar8 - 2;
                          pbVar11 = pbVar11 + 3;
                          uudecode = local_50;
                        }
                        bVar16 = true;
                        local_70 = pbVar10;
                        if ((long)uVar8 < 1) {
                          uVar8 = 0;
                        }
                        else {
                          bVar1 = *pbVar11;
                          bVar16 = ""[bVar1] != '\0';
                          if (bVar16) {
                            pbVar11 = pbVar11 + 1;
                            *pbVar10 = (byte)uVar12 | bVar1 & 0x3f ^ 0x20;
                            local_60 = local_60 + 1;
                            uVar8 = uVar8 - 1;
                            local_70 = pbVar10 + 1;
                          }
                        }
                      }
LAB_00459715:
                      lVar6 = local_60;
                    } while (bVar16);
                    if (uVar8 != 0) goto LAB_0045972c;
                  }
LAB_00459770:
                  iVar4 = 0;
                  goto LAB_00459753;
                }
              }
LAB_0045972c:
              a = self->archive;
              iVar4 = -1;
              fmt = "Insufficient compressed data";
LAB_00459741:
              archive_set_error(&a->archive,iVar4,fmt);
              iVar4 = 1;
            }
          }
          else {
            if (iVar4 == 2) {
              if ((unaff_R13 - local_38 == 3) && (b[2] == 100 && *(short *)b == 0x6e65)) {
LAB_0045941d:
                uudecode->state = 0;
                goto LAB_00459770;
              }
              goto LAB_0045972c;
            }
            if (iVar4 == 3) {
              iVar4 = 3;
              if ((long)(local_60 + unaff_R13 * 2) < 0x10001) {
                lVar6 = unaff_R13 - local_38;
                pbVar11 = b;
                if (((2 < lVar6) && (*b == 0x3d)) && ((b[1] == 0x3d && (b[2] == 0x3d))))
                goto LAB_0045941d;
                do {
                  lVar7 = lVar6;
                  pbVar9 = pbVar11;
                  lVar13 = local_60;
                  if (lVar6 < 1) break;
                  if ((""[*pbVar11] == '\0') || (""[pbVar11[1]] == '\0')) {
                    bVar16 = false;
                  }
                  else {
                    pbVar9 = pbVar11 + 2;
                    uVar12 = base64num[pbVar11[1]] << 0xc | base64num[*pbVar11] << 0x12;
                    *local_70 = (byte)(uVar12 >> 0x10);
                    lVar13 = local_60 + 1;
                    lVar7 = lVar6 + -2;
                    pbVar10 = local_70 + 1;
                    if (2 < lVar6) {
                      uVar8 = (ulong)*pbVar9;
                      if ((uVar8 == 0x3d) || (""[uVar8] == '\0')) {
                        bVar16 = false;
                        uudecode = local_50;
                        local_70 = local_70 + 1;
                        goto LAB_00459389;
                      }
                      pbVar9 = pbVar11 + 3;
                      uVar12 = uVar12 | base64num[uVar8] << 6;
                      local_70[1] = (byte)(uVar12 >> 8);
                      lVar13 = local_60 + 2;
                      lVar7 = lVar6 + -3;
                      pbVar10 = local_70 + 2;
                    }
                    local_70 = pbVar10;
                    bVar16 = true;
                    uudecode = local_50;
                    if (0 < lVar7) {
                      uVar8 = (ulong)*pbVar9;
                      if ((uVar8 == 0x3d) || (""[uVar8] == '\0')) {
                        bVar16 = false;
                      }
                      else {
                        pbVar9 = pbVar9 + 1;
                        *local_70 = (byte)uVar12 | (byte)base64num[uVar8];
                        lVar13 = lVar13 + 1;
                        lVar7 = lVar7 + -1;
                        local_70 = local_70 + 1;
                      }
                    }
                  }
LAB_00459389:
                  lVar6 = lVar7;
                  pbVar11 = pbVar9;
                  local_60 = lVar13;
                } while (bVar16);
                iVar4 = 0;
                local_60 = lVar13;
                if ((lVar7 != 0) && (*pbVar9 != 0x3d)) goto LAB_0045972c;
              }
            }
            else {
              if (0x1ffff < (long)(unaff_R13 + local_60)) {
                a = self->archive;
                iVar4 = 0x54;
                fmt = "Invalid format data";
                goto LAB_00459741;
              }
              if (((long)(unaff_R13 - local_38) < 0xb) ||
                 (*(short *)(b + 4) != 0x206e || *(int *)b != 0x69676562)) {
                if (((long)(unaff_R13 - local_38) < 0x12) ||
                   (*(long *)(b + 5) != 0x203436657361622d || *(long *)b != 0x61622d6e69676562)) {
                  bVar16 = true;
                  bVar2 = false;
                  lVar6 = 0;
                }
                else {
                  lVar6 = 0xd;
                  bVar16 = false;
                  bVar2 = false;
                }
              }
              else {
                lVar6 = 6;
                bVar2 = true;
                bVar16 = false;
              }
              iVar4 = 0;
              if ((((!bVar16) && ((b[lVar6] & 0xf8) == 0x30)) && ((b[lVar6 + 1] & 0xf8) == 0x30)) &&
                 (((b[lVar6 + 2] & 0xf8) == 0x30 && (b[lVar6 + 3] == 0x20)))) {
                if (bVar2) {
                  uudecode->state = 1;
                }
                else {
                  uudecode->state = 3;
                }
              }
            }
          }
        }
LAB_00459753:
        if (iVar4 != 0) goto LAB_0045977d;
        b = b + unaff_R13;
        sVar14 = sVar14 + unaff_R13;
        sVar15 = unaff_R13;
        if ((long)local_58 <= (long)sVar14) goto LAB_004597d5;
      } while( true );
    }
    sVar14 = 0;
  }
  local_60 = 0;
  goto LAB_004597d5;
LAB_0045977d:
  if (iVar4 - 3U < 2) {
LAB_004597d5:
    lVar6 = 0;
    if ((long)local_48 < (long)local_58) {
      lVar6 = local_48 - local_58;
    }
    __archive_read_filter_consume(self->upstream,lVar6 + sVar14);
    *local_40 = uudecode->out_buff;
    uudecode->total = uudecode->total + local_60;
    return local_60;
  }
  if (iVar4 != 2) {
    return -0x1e;
  }
  b = (byte *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_58);
  bVar16 = b == (byte *)0x0;
  if ((bVar16) && ((long)local_58 < 0)) {
    return -0x1e;
  }
  goto LAB_00459160;
}

Assistant:

static ssize_t
uudecode_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct uudecode *uudecode;
	const unsigned char *b, *d;
	unsigned char *out;
	ssize_t avail_in, ravail;
	ssize_t used;
	ssize_t total;
	ssize_t len, llen, nl;

	uudecode = (struct uudecode *)self->data;

read_more:
	d = __archive_read_filter_ahead(self->upstream, 1, &avail_in);
	if (d == NULL && avail_in < 0)
		return (ARCHIVE_FATAL);
	/* Quiet a code analyzer; make sure avail_in must be zero
	 * when d is NULL. */
	if (d == NULL)
		avail_in = 0;
	used = 0;
	total = 0;
	out = uudecode->out_buff;
	ravail = avail_in;
	if (uudecode->state == ST_IGNORE) {
		used = avail_in;
		goto finish;
	}
	if (uudecode->in_cnt) {
		/*
		 * If there is remaining data which is saved by
		 * previous calling, use it first.
		 */
		if (ensure_in_buff_size(self, uudecode,
		    avail_in + uudecode->in_cnt) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		memcpy(uudecode->in_buff + uudecode->in_cnt,
		    d, avail_in);
		d = uudecode->in_buff;
		avail_in += uudecode->in_cnt;
		uudecode->in_cnt = 0;
	}
	for (;used < avail_in; d += llen, used += llen) {
		int64_t l, body;

		b = d;
		len = get_line(b, avail_in - used, &nl);
		if (len < 0) {
			/* Non-ascii character is found. */
			if (uudecode->state == ST_FIND_HEAD &&
			    (uudecode->total > 0 || total > 0)) {
				uudecode->state = ST_IGNORE;
				used = avail_in;
				goto finish;
			}
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Insufficient compressed data");
			return (ARCHIVE_FATAL);
		}
		llen = len;
		if ((nl == 0) && (uudecode->state != ST_UUEND)) {
			/*
			 * Save remaining data which does not contain
			 * NL('\n','\r').
			 */
			if (ensure_in_buff_size(self, uudecode, len)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			if (uudecode->in_buff != b)
				memmove(uudecode->in_buff, b, len);
			uudecode->in_cnt = (int)len;
			if (total == 0) {
				/* Do not return 0; it means end-of-file.
				 * We should try to read bytes more. */
				__archive_read_filter_consume(
				    self->upstream, ravail);
				goto read_more;
			}
			used += len;
			break;
		}
		switch (uudecode->state) {
		default:
		case ST_FIND_HEAD:
			/* Do not read more than UUENCODE_BID_MAX_READ bytes */
			if (total + len >= UUENCODE_BID_MAX_READ) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Invalid format data");
				return (ARCHIVE_FATAL);
			}
			if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
				l = 6;
			else if (len - nl >= 18 &&
			    memcmp(b, "begin-base64 ", 13) == 0)
				l = 13;
			else
				l = 0;
			if (l != 0 && b[l] >= '0' && b[l] <= '7' &&
			    b[l+1] >= '0' && b[l+1] <= '7' &&
			    b[l+2] >= '0' && b[l+2] <= '7' && b[l+3] == ' ') {
				if (l == 6)
					uudecode->state = ST_READ_UU;
				else
					uudecode->state = ST_READ_BASE64;
			}
			break;
		case ST_READ_UU:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			body = len - nl;
			if (!uuchar[*b] || body <= 0) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			/* Get length of undecoded bytes of curent line. */
			l = UUDECODE(*b++);
			body--;
			if (l > body) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			if (l == 0) {
				uudecode->state = ST_UUEND;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (l > 0) {
					if (!uuchar[b[0]] || !uuchar[b[1]])
						break;
					n = UUDECODE(*b++) << 18;
					n |= UUDECODE(*b++) << 12;
					*out++ = n >> 16; total++;
					--l;
				}
				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++) << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++);
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_UUEND:
			if (len - nl == 3 && memcmp(b, "end ", 3) == 0)
				uudecode->state = ST_FIND_HEAD;
			else {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_READ_BASE64:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			l = len - nl;
			if (l >= 3 && b[0] == '=' && b[1] == '=' &&
			    b[2] == '=') {
				uudecode->state = ST_FIND_HEAD;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (l > 0) {
					if (!base64[b[0]] || !base64[b[1]])
						break;
					n = base64num[*b++] << 18;
					n |= base64num[*b++] << 12;
					*out++ = n >> 16; total++;
					l -= 2;
				}
				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++] << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++];
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l && *b != '=') {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		}
	}
finish:
	if (ravail < avail_in)
		used -= avail_in - ravail;
	__archive_read_filter_consume(self->upstream, used);

	*buff = uudecode->out_buff;
	uudecode->total += total;
	return (total);
}